

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_subsuu_s_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  cVar1 = (char)(1L << ((char)df + 3U & 0x3f));
  uVar6 = 0xffffffffffffffff >> (-cVar1 & 0x3fU);
  uVar2 = 1L << (cVar1 - 1U & 0x3f);
  uVar5 = arg1 & uVar6;
  uVar6 = uVar6 & arg2;
  uVar4 = uVar5 - uVar6;
  if (uVar6 <= uVar5 && uVar4 != 0) {
    uVar5 = uVar2 - 1;
    if (uVar4 < uVar2 - 1) {
      uVar5 = uVar4;
    }
    return uVar5;
  }
  uVar3 = -uVar2;
  if (uVar6 - uVar5 < uVar2) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

static inline int64_t msa_subsuu_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    uint64_t u_arg1 = UNSIGNED(arg1, df);
    uint64_t u_arg2 = UNSIGNED(arg2, df);
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (u_arg1 > u_arg2) {
        return u_arg1 - u_arg2 < (uint64_t)max_int ?
            (int64_t)(u_arg1 - u_arg2) :
            max_int;
    } else {
        return u_arg2 - u_arg1 < (uint64_t)(-min_int) ?
            (int64_t)(u_arg1 - u_arg2) :
            min_int;
    }
}